

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_multiply_target_and_add<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
          (Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,Field_element *val,
          Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
          *column)

{
  ulong uVar1;
  uint uVar2;
  ID_index IVar3;
  undefined8 *puVar4;
  Element *e1;
  pointer ppEVar5;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  _ValueType __value;
  undefined4 *puVar10;
  invalid_argument *this_00;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
  *this_01;
  ulong uVar15;
  iterator __begin0;
  undefined8 *puVar16;
  pointer ppEVar17;
  bool bVar18;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_38;
  
  if (*val == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"A chain column should not be multiplied by 0.")
    ;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_01 = (vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
             *)(this + 0x10);
  puVar16 = *(undefined8 **)(this + 0x10);
  puVar4 = *(undefined8 **)(this + 0x18);
  if (puVar16 == puVar4) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              *)this_01,
             (long)(column->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(column->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppEVar17 = (column->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar5 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar17 != ppEVar5) {
      uVar13 = 0;
      do {
        pEVar6 = *ppEVar17;
        IVar3 = pEVar6->rowIndex_;
        puVar10 = (undefined4 *)operator_new(8);
        *puVar10 = 0;
        puVar10[1] = IVar3;
        *(undefined4 **)(*(long *)this_01 + uVar13 * 8) = puVar10;
        **(uint **)(*(long *)this_01 + uVar13 * 8) =
             (pEVar6->super_Entry_field_element_option).element_;
        ppEVar17 = ppEVar17 + 1;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (ppEVar17 != ppEVar5);
    }
    *(int *)(this + 0x28) = (int)((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10)) >> 3);
    bVar18 = true;
  }
  else {
    uVar11 = 0;
    do {
      e1 = (Element *)*puVar16;
      persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x30),e1,*val);
      if (e1[1] == *(Element *)(this + 4)) {
        uVar12 = *e1;
        uVar2 = **(uint **)(this + 0x30);
        if (uVar2 <= uVar11) {
          uVar11 = uVar11 % uVar2;
        }
        if (uVar2 <= uVar12) {
          uVar12 = uVar12 % uVar2;
        }
        uVar9 = uVar2;
        if (uVar11 + uVar12 < uVar2) {
          uVar9 = 0;
        }
        if (CARRY4(uVar11,uVar12)) {
          uVar9 = uVar2;
        }
        uVar11 = (uVar11 + uVar12) - uVar9;
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar4);
    ppEVar5 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar17 = (column->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppEVar17 != ppEVar5;
        ppEVar17 = ppEVar17 + 1) {
      pEVar6 = *ppEVar17;
      *(int *)(this + 0x28) = *(int *)(this + 0x28) + 1;
      IVar3 = pEVar6->rowIndex_;
      if (IVar3 == *(ID_index *)(this + 4)) {
        uVar12 = (pEVar6->super_Entry_field_element_option).element_;
        uVar2 = **(uint **)(this + 0x30);
        if (uVar2 <= uVar11) {
          uVar11 = uVar11 % uVar2;
        }
        if (uVar2 <= uVar12) {
          uVar12 = uVar12 % uVar2;
        }
        uVar9 = uVar2;
        if (uVar11 + uVar12 < uVar2) {
          uVar9 = 0;
        }
        if (CARRY4(uVar11,uVar12)) {
          uVar9 = uVar2;
        }
        uVar11 = (uVar11 + uVar12) - uVar9;
      }
      local_38 = (Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                  *)operator_new(8);
      (local_38->super_Entry_field_element_option).element_ = 0;
      local_38->rowIndex_ = IVar3;
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
      ::
      emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                (this_01,&local_38);
      lVar14 = *(long *)(this + 0x18);
      puVar7 = *(uint **)(lVar14 + -8);
      *puVar7 = (pEVar6->super_Entry_field_element_option).element_;
      lVar8 = *(long *)(this + 0x10);
      lVar14 = lVar14 - lVar8 >> 3;
      uVar13 = lVar14 - 1;
      if (1 < lVar14) {
        uVar12 = puVar7[1];
        do {
          uVar1 = uVar13 - 1;
          uVar15 = uVar1 >> 1;
          lVar14 = *(long *)(lVar8 + uVar15 * 8);
          if (uVar12 <= *(uint *)(lVar14 + 4)) goto LAB_00153377;
          *(long *)(lVar8 + uVar13 * 8) = lVar14;
          uVar13 = uVar15;
        } while (1 < uVar1);
        uVar13 = 0;
      }
LAB_00153377:
      *(uint **)(lVar8 + uVar13 * 8) = puVar7;
    }
    if ((ulong)(*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) <
        (ulong)(uint)(*(int *)(this + 0x28) * 2)) {
      Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
    bVar18 = uVar11 == 0;
  }
  return bVar18;
}

Assistant:

inline bool Heap_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      column_[i++]->set_element(entry.get_element());
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(0);

  for (Entry* entry : column_) {
    operators_->multiply_inplace(entry->get_element(), val);
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry->get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry->get_element());
    }
  }

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
    }
    column_.push_back(entryPool_->construct(entry.get_row_index()));
    column_.back()->set_element(entry.get_element());
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}